

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar97;
  undefined4 uVar98;
  uint uVar99;
  uint extraout_EAX;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  int extraout_EDX;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  secp256k1_fe *r;
  secp256k1_fe *a;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  code *pcVar119;
  ulong uVar120;
  code *pcVar121;
  secp256k1_fe *psVar122;
  code *pcVar123;
  uint extraout_XMM0_Da;
  uint uVar124;
  uint extraout_XMM0_Db;
  uint uVar126;
  uint extraout_XMM0_Dc;
  uint uVar127;
  undefined1 auVar125 [16];
  uint extraout_XMM0_Dd;
  uint uVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uchar auStack_1e8 [32];
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  ulong uStack_1b8;
  secp256k1_fe *psStack_1b0;
  code *pcStack_1a8;
  code *pcStack_198;
  undefined1 auStack_190 [32];
  secp256k1_fe sStack_170;
  long lStack_148;
  undefined1 auStack_140 [16];
  secp256k1_fe sStack_128;
  code *pcStack_100;
  ulong uStack_f8;
  secp256k1_fe *psStack_f0;
  undefined8 uStack_e8;
  secp256k1_fe *psStack_e0;
  code *local_d0;
  secp256k1_fe local_c8;
  ulong local_98;
  secp256k1_fe *local_90;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  pcVar121 = secp256k1_fe_impl_inv_var;
  if (var == 0) {
    pcVar121 = secp256k1_fe_impl_inv;
  }
  psStack_e0 = (secp256k1_fe *)0x15edec;
  (*pcVar121)(&local_c8);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_c8.n[4];
    out->n[2] = local_c8.n[2];
    out->n[3] = local_c8.n[3];
    out->n[0] = local_c8.n[0];
    out->n[1] = local_c8.n[1];
  }
  local_58.n[4] = x->n[4];
  local_58.n[0] = x->n[0];
  local_58.n[1] = x->n[1];
  local_58.n[2] = x->n[2];
  local_58.n[3] = x->n[3];
  psStack_e0 = (secp256k1_fe *)0x15ee33;
  iVar97 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
  if (iVar97 != 0) {
    psStack_e0 = (secp256k1_fe *)0x15ee41;
    iVar97 = secp256k1_fe_impl_normalizes_to_zero(&local_c8);
    if (iVar97 != 0) {
      return;
    }
    psStack_e0 = (secp256k1_fe *)0x15ee4e;
    test_inverse_field_cold_1();
  }
  r_00 = &local_58;
  uVar103 = x->n[0];
  uVar110 = x->n[1];
  pcVar119 = (code *)x->n[2];
  uVar120 = x->n[3];
  psVar122 = (secp256k1_fe *)x->n[4];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_c8.n[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar120;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_c8.n[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = pcVar119;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_c8.n[2];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar110;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_c8.n[3];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar103;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_c8.n[4];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = psVar122;
  uVar100 = SUB168(auVar5 * auVar51,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar100 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar48 + auVar1 * auVar47 + auVar3 * auVar49 + auVar4 * auVar50 +
           auVar6 * ZEXT816(0x1000003d10);
  uVar102 = auVar1._0_8_;
  local_88.n[0] = uVar102 & 0xfffffffffffff;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar102 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_c8.n[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = psVar122;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_c8.n[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar120;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_c8.n[2];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = pcVar119;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_c8.n[3];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar110;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_c8.n[4];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar103;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar100 >> 0x34 | SUB168(auVar5 * auVar51,8) << 0xc;
  auVar1 = auVar7 * auVar52 + auVar89 + auVar8 * auVar53 + auVar9 * auVar54 + auVar10 * auVar55 +
           auVar11 * auVar56 + auVar12 * ZEXT816(0x1000003d10);
  uVar100 = auVar1._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar100 >> 0x34 | auVar1._8_8_ << 0xc;
  local_98 = (uVar100 & 0xfffffffffffff) >> 0x30;
  a = (secp256k1_fe *)(uVar100 & 0xffffffffffff);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_c8.n[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar103;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_c8.n[1];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = psVar122;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_c8.n[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar120;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_c8.n[3];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = pcVar119;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_c8.n[4];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar110;
  auVar1 = auVar14 * auVar58 + auVar90 + auVar15 * auVar59 + auVar16 * auVar60 + auVar17 * auVar61;
  uVar100 = auVar1._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar100 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = (uVar100 & 0xfffffffffffff) << 4 | local_98;
  auVar1 = auVar13 * auVar57 + ZEXT816(0x1000003d1) * auVar62;
  uVar102 = auVar1._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar102 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_c8.n[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar110;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_c8.n[1];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar103;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_c8.n[2];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = psVar122;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_c8.n[3];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar120;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_c8.n[4];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = pcVar119;
  auVar2 = auVar20 * auVar65 + auVar92 + auVar21 * auVar66 + auVar22 * auVar67;
  uVar100 = auVar2._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar100 & 0xfffffffffffff;
  auVar1 = auVar18 * auVar63 + auVar91 + auVar19 * auVar64 + auVar23 * ZEXT816(0x1000003d10);
  uVar109 = auVar1._0_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar100 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar109 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_c8.n[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = pcVar119;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_c8.n[1];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar110;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_c8.n[2];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar103;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_c8.n[3];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = psVar122;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_c8.n[4];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar120;
  auVar2 = auVar27 * auVar71 + auVar94 + auVar28 * auVar72;
  uVar103 = auVar2._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar103 & 0xfffffffffffff;
  auVar1 = auVar24 * auVar68 + auVar93 + auVar25 * auVar69 + auVar26 * auVar70 +
           auVar29 * ZEXT816(0x1000003d10);
  uVar110 = auVar1._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (uVar110 >> 0x34 | auVar1._8_8_ << 0xc) + local_88.n[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar103 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar95 = auVar30 * ZEXT816(0x1000003d10) + auVar95;
  uVar103 = auVar95._0_8_;
  local_58.n[0] = (uVar102 & 0xfffffffffffff) + 0xffffefffffc2e;
  local_58.n[1] = (uVar109 & 0xfffffffffffff) + 0xfffffffffffff;
  local_58.n[2] = (uVar110 & 0xfffffffffffff) + 0xfffffffffffff;
  local_58.n[3] = (uVar103 & 0xfffffffffffff) + 0xfffffffffffff;
  local_58.n[4] = (long)a[0x66666666666].n + (uVar103 >> 0x34 | auVar95._8_8_ << 0xc) + 0xf;
  psStack_e0 = (secp256k1_fe *)0x15f199;
  local_d0 = pcVar121;
  local_90 = a;
  iVar97 = secp256k1_fe_impl_normalizes_to_zero(r_00);
  if (iVar97 == 0) {
    psStack_e0 = (secp256k1_fe *)0x15f296;
    test_inverse_field_cold_3();
  }
  else {
    local_88.n[0] = x->n[0] + 0xffffefffffc2e;
    local_88.n[1] = x->n[1] + 0xfffffffffffff;
    local_88.n[2] = x->n[2] + 0xfffffffffffff;
    local_88.n[3] = x->n[3] + 0xfffffffffffff;
    local_88.n[4] = x->n[4] + 0xffffffffffff;
    psStack_e0 = (secp256k1_fe *)0x15f1ed;
    iVar97 = secp256k1_fe_impl_normalizes_to_zero_var(&local_88);
    pcVar119 = local_d0;
    if (iVar97 != 0) {
      return;
    }
    psVar122 = &local_88;
    psStack_e0 = (secp256k1_fe *)0x15f208;
    (*local_d0)(psVar122,psVar122);
    r_00 = &local_c8;
    local_c8.n[0] = local_c8.n[0] + 0xffffefffffc2e;
    local_c8.n[1] = local_c8.n[1] + 0xfffffffffffff;
    local_c8.n[2] = local_c8.n[2] + 0xfffffffffffff;
    local_c8.n[3] = local_c8.n[3] + 0xfffffffffffff;
    local_c8.n[4] = local_c8.n[4] + 0xffffffffffff;
    psStack_e0 = (secp256k1_fe *)0x15f23c;
    a = r_00;
    (*pcVar119)(r_00);
    local_c8.n[0] = local_c8.n[0] + local_88.n[0] + 1;
    local_c8.n[1] = local_c8.n[1] + local_88.n[1];
    local_c8.n[2] = local_c8.n[2] + local_88.n[2];
    local_c8.n[3] = local_c8.n[3] + local_88.n[3];
    local_c8.n[4] = local_c8.n[4] + local_88.n[4];
    psStack_e0 = (secp256k1_fe *)0x15f27b;
    iVar97 = secp256k1_fe_impl_normalizes_to_zero_var(r_00);
    if (iVar97 != 0) {
      return;
    }
  }
  psStack_e0 = (secp256k1_fe *)test_inverse_scalar;
  test_inverse_field_cold_2();
  uStack_e8 = 0xffffffffffff;
  pcVar121 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar121 = secp256k1_scalar_inverse;
  }
  r = (secp256k1_fe *)auStack_190;
  pcStack_1a8 = (code *)0x15f2d1;
  r_01 = r;
  sStack_128.n[4] = (uint64_t)&local_c8;
  pcStack_100 = pcVar119;
  uStack_f8 = uVar120;
  psStack_f0 = psVar122;
  psStack_e0 = x;
  uVar98 = (*pcVar121)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_190._20_4_,auStack_190._16_4_);
    r_00->n[3] = CONCAT44(auStack_190._28_4_,auStack_190._24_4_);
    r_00->n[0] = CONCAT44(auStack_190._4_4_,auStack_190._0_4_);
    r_00->n[1] = CONCAT44(auStack_190._12_4_,auStack_190._8_4_);
  }
  uVar124 = 0;
  uVar126 = 0;
  uVar127 = 0;
  uVar128 = 0;
  auVar129._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar129._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar129._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar129._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar99 = movmskps(uVar98,auVar129);
  uVar99 = uVar99 ^ 0xf;
  if (uVar99 != 0) {
    uVar103 = a->n[0];
    uVar110 = a->n[1];
    uVar100 = a->n[2];
    uVar108 = CONCAT44(auStack_190._4_4_,auStack_190._0_4_);
    pcVar119 = (code *)CONCAT44(auStack_190._12_4_,auStack_190._8_4_);
    uVar120 = CONCAT44(auStack_190._20_4_,auStack_190._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_190._28_4_,auStack_190._24_4_);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar103;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar108;
    uVar104 = SUB168(auVar31 * auVar73,8);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar104;
    sStack_170.n[0] = SUB168(auVar31 * auVar73,0);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar103;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = pcVar119;
    auVar32 = auVar32 * auVar74;
    uVar111 = SUB168(auVar32 + auVar96,0);
    uVar112 = SUB168(auVar32 + auVar96,8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar110;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar108;
    uVar105 = SUB168(auVar33 * auVar75,8);
    uVar101 = SUB168(auVar33 * auVar75,0);
    uVar102 = (ulong)CARRY8(uVar111,uVar101);
    uVar109 = uVar112 + uVar105;
    uVar113 = uVar109 + uVar102;
    uVar115 = (ulong)CARRY8(auVar32._8_8_,(ulong)CARRY8(uVar104,auVar32._0_8_)) +
              (ulong)(CARRY8(uVar112,uVar105) || CARRY8(uVar109,uVar102));
    sStack_170.n[1] = uVar111 + uVar101;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar103;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar120;
    uVar106 = SUB168(auVar34 * auVar76,8);
    uVar102 = SUB168(auVar34 * auVar76,0);
    uVar101 = uVar113 + uVar102;
    uVar102 = (ulong)CARRY8(uVar113,uVar102);
    uVar104 = uVar115 + uVar106;
    uVar116 = uVar104 + uVar102;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar110;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = pcVar119;
    uVar113 = SUB168(auVar35 * auVar77,8);
    uVar109 = SUB168(auVar35 * auVar77,0);
    uVar114 = uVar101 + uVar109;
    uVar109 = (ulong)CARRY8(uVar101,uVar109);
    uVar105 = uVar116 + uVar113;
    uVar117 = uVar105 + uVar109;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar100;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar108;
    uVar107 = SUB168(auVar36 * auVar78,8);
    uVar112 = SUB168(auVar36 * auVar78,0);
    uVar101 = (ulong)CARRY8(uVar114,uVar112);
    uVar111 = uVar117 + uVar107;
    uVar118 = uVar111 + uVar101;
    uVar115 = (ulong)(CARRY8(uVar115,uVar106) || CARRY8(uVar104,uVar102)) +
              (ulong)(CARRY8(uVar116,uVar113) || CARRY8(uVar105,uVar109)) +
              (ulong)(CARRY8(uVar117,uVar107) || CARRY8(uVar111,uVar101));
    sStack_170.n[2] = uVar114 + uVar112;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar103;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = r_00;
    uVar112 = SUB168(auVar37 * auVar79,8);
    uVar103 = SUB168(auVar37 * auVar79,0);
    uVar109 = uVar118 + uVar103;
    uVar103 = (ulong)CARRY8(uVar118,uVar103);
    uVar104 = uVar115 + uVar112;
    uVar114 = uVar104 + uVar103;
    pcVar123 = (code *)a->n[3];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar110;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar120;
    uVar106 = SUB168(auVar38 * auVar80,8);
    uVar102 = SUB168(auVar38 * auVar80,0);
    uVar101 = uVar109 + uVar102;
    uVar102 = (ulong)CARRY8(uVar109,uVar102);
    uVar105 = uVar114 + uVar106;
    uVar116 = uVar105 + uVar102;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar100;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = pcVar119;
    uVar113 = SUB168(auVar39 * auVar81,8);
    uVar109 = SUB168(auVar39 * auVar81,0);
    uVar118 = uVar101 + uVar109;
    uVar109 = (ulong)CARRY8(uVar101,uVar109);
    uVar111 = uVar116 + uVar113;
    uVar117 = uVar111 + uVar109;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = pcVar123;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar108;
    uVar107 = SUB168(auVar40 * auVar82,8);
    uVar101 = SUB168(auVar40 * auVar82,0);
    sStack_170.n[3] = uVar118 + uVar101;
    uVar101 = (ulong)CARRY8(uVar118,uVar101);
    uVar108 = uVar117 + uVar107;
    uVar118 = uVar108 + uVar101;
    uVar112 = (ulong)(CARRY8(uVar115,uVar112) || CARRY8(uVar104,uVar103)) +
              (ulong)(CARRY8(uVar114,uVar106) || CARRY8(uVar105,uVar102)) +
              (ulong)(CARRY8(uVar116,uVar113) || CARRY8(uVar111,uVar109)) +
              (ulong)(CARRY8(uVar117,uVar107) || CARRY8(uVar108,uVar101));
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar110;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = r_00;
    uVar105 = SUB168(auVar41 * auVar83,8);
    uVar103 = SUB168(auVar41 * auVar83,0);
    uVar102 = uVar118 + uVar103;
    uVar103 = (ulong)CARRY8(uVar118,uVar103);
    uVar109 = uVar112 + uVar105;
    uVar106 = uVar109 + uVar103;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar100;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar120;
    uVar111 = SUB168(auVar42 * auVar84,8);
    uVar110 = SUB168(auVar42 * auVar84,0);
    uVar104 = uVar102 + uVar110;
    uVar110 = (ulong)CARRY8(uVar102,uVar110);
    uVar101 = uVar106 + uVar111;
    uVar113 = uVar101 + uVar110;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = pcVar123;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = pcVar119;
    uVar108 = SUB168(auVar43 * auVar85,8);
    uVar102 = SUB168(auVar43 * auVar85,0);
    sStack_170.n[4] = uVar104 + uVar102;
    uVar102 = (ulong)CARRY8(uVar104,uVar102);
    uVar104 = uVar113 + uVar108;
    uVar107 = uVar104 + uVar102;
    uVar104 = (ulong)(CARRY8(uVar112,uVar105) || CARRY8(uVar109,uVar103)) +
              (ulong)(CARRY8(uVar106,uVar111) || CARRY8(uVar101,uVar110)) +
              (ulong)(CARRY8(uVar113,uVar108) || CARRY8(uVar104,uVar102));
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar100;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = r_00;
    uVar109 = SUB168(auVar44 * auVar86,8);
    uVar103 = SUB168(auVar44 * auVar86,0);
    uVar102 = uVar107 + uVar103;
    uVar103 = (ulong)CARRY8(uVar107,uVar103);
    uVar100 = uVar104 + uVar109;
    uVar105 = uVar100 + uVar103;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = pcVar123;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar120;
    uVar101 = SUB168(auVar45 * auVar87,8);
    uVar110 = SUB168(auVar45 * auVar87,0);
    lStack_148 = uVar102 + uVar110;
    uVar110 = (ulong)CARRY8(uVar102,uVar110);
    uVar102 = uVar105 + uVar101;
    auStack_140._8_8_ =
         (ulong)(CARRY8(uVar104,uVar109) || CARRY8(uVar100,uVar103)) +
         (ulong)(CARRY8(uVar105,uVar101) || CARRY8(uVar102,uVar110));
    auStack_140._0_8_ = uVar102 + uVar110;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = pcVar123;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = r_00;
    auStack_140 = auVar46 * auVar88 + auStack_140;
    r = &sStack_128;
    pcStack_1a8 = (code *)0x15f46c;
    r_01 = r;
    pcStack_198 = pcVar121;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r,(uint64_t *)(auStack_190 + 0x20));
    if (((sStack_128.n[0] != 1 || sStack_128.n[1] != 0) || sStack_128.n[2] != 0) ||
        sStack_128.n[3] != 0) {
      pcStack_1a8 = (code *)0x15f563;
      test_inverse_scalar_cold_1();
      goto LAB_0015f563;
    }
    pcStack_1a8 = (code *)0x15f49c;
    iVar97 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_190 + 0x20),(secp256k1_scalar *)a,
                        &scalar_minus_one);
    pcVar121 = pcStack_198;
    auVar125._0_4_ = -(uint)((int)sStack_170.n[2] == 0 && (int)sStack_170.n[0] == 0);
    auVar125._4_4_ = -(uint)(sStack_170.n[2]._4_4_ == 0 && sStack_170.n[0]._4_4_ == 0);
    auVar125._8_4_ = -(uint)((int)sStack_170.n[3] == 0 && (int)sStack_170.n[1] == 0);
    auVar125._12_4_ = -(uint)(sStack_170.n[3]._4_4_ == 0 && sStack_170.n[1]._4_4_ == 0);
    iVar97 = movmskps(iVar97,auVar125);
    if (iVar97 == 0xf) {
      return;
    }
    r = (secp256k1_fe *)(auStack_190 + 0x20);
    pcStack_1a8 = (code *)0x15f4cc;
    (*pcStack_198)(r,r);
    r_00 = (secp256k1_fe *)auStack_190;
    pcStack_1a8 = (code *)0x15f4e3;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    pcStack_1a8 = (code *)0x15f4ec;
    (*pcVar121)(r_00,r_00);
    pcStack_1a8 = (code *)0x15f4fe;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    pcStack_1a8 = (code *)0x15f50c;
    r_01 = r_00;
    iVar97 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    auVar130._0_4_ = -(uint)(auStack_190._16_4_ == 0 && auStack_190._0_4_ == 0);
    auVar130._4_4_ = -(uint)(auStack_190._20_4_ == 0 && auStack_190._4_4_ == 0);
    auVar130._8_4_ = -(uint)(auStack_190._24_4_ == 0 && auStack_190._8_4_ == 0);
    auVar130._12_4_ = -(uint)(auStack_190._28_4_ == 0 && auStack_190._12_4_ == 0);
    iVar97 = movmskps(iVar97,auVar130);
    if (iVar97 == 0xf) {
      return;
    }
    pcStack_1a8 = (code *)0x15f530;
    test_inverse_scalar_cold_2();
    uVar99 = extraout_EAX;
    uVar124 = extraout_XMM0_Da;
    uVar126 = extraout_XMM0_Db;
    uVar127 = extraout_XMM0_Dc;
    uVar128 = extraout_XMM0_Dd;
  }
  auVar131._0_4_ = -(uint)((auStack_190._16_4_ | auStack_190._0_4_) == uVar124);
  auVar131._4_4_ = -(uint)((auStack_190._20_4_ | auStack_190._4_4_) == uVar126);
  auVar131._8_4_ = -(uint)((auStack_190._24_4_ | auStack_190._8_4_) == uVar127);
  auVar131._12_4_ = -(uint)((auStack_190._28_4_ | auStack_190._12_4_) == uVar128);
  iVar97 = movmskps(uVar99,auVar131);
  pcVar123 = pcVar121;
  if (iVar97 == 0xf) {
    return;
  }
LAB_0015f563:
  pcStack_1a8 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_1c8 = r;
  pcStack_1c0 = pcVar119;
  uStack_1b8 = uVar120;
  psStack_1b0 = r_00;
  pcStack_1a8 = pcVar123;
  while( true ) {
    secp256k1_testrand256(auStack_1e8);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_1e8);
    if (r_01->n[0] < 0xffffefffffc2f) {
      return;
    }
    if (r_01->n[4] != 0xffffffffffff) break;
    if ((r_01->n[2] & r_01->n[3] & r_01->n[1]) != 0xfffffffffffff) {
      return;
    }
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}